

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.h
# Opt level: O0

void __thiscall
priority_queue_t<std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
::priority_queue_t(priority_queue_t<std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
                   *this,coefficient_t _modulus,size_t _dense_threshold)

{
  _Elt_pointer in_RDX;
  undefined2 in_SI;
  priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
  *in_RDI;
  
  std::
  priority_queue<filtration_entry_t,std::deque<filtration_entry_t,std::allocator<filtration_entry_t>>,greater_filtration_or_smaller_index<filtration_entry_t>>
  ::priority_queue<std::deque<filtration_entry_t,std::allocator<filtration_entry_t>>,void>(in_RDI);
  std::
  unordered_map<int,_bool,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_bool>_>_>
  ::unordered_map((unordered_map<int,_bool,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_bool>_>_>
                   *)0x16cb43);
  *(undefined1 *)
   &in_RDI[1].c.super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>._M_impl.
    super__Deque_impl_data._M_finish._M_first = 0;
  *(undefined2 *)
   ((long)&in_RDI[1].c.super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_first + 2) = in_SI;
  in_RDI[1].c.super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = in_RDX;
  return;
}

Assistant:

priority_queue_t(coefficient_t _modulus, size_t _dense_threshold)
	    : modulus(_modulus), dense_threshold(_dense_threshold) {}